

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_junit_logger__on_test_suite_end(fct_logger_i *logger_,fct_logger_evt_t *e)

{
  fct_ts_t *ts_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  fct_test_t *test_00;
  void *pvVar6;
  ulong uVar7;
  double dVar8;
  fctchk_t *chk;
  size_t num_itemschk;
  size_t item_ichk;
  fct_test_t *test;
  size_t num_itemstest;
  size_t item_itest;
  int first_out_line;
  int read_length;
  char std_buffer [1024];
  double elasped_time;
  int is_pass;
  fct_ts_t *ts;
  fct_logger_evt_t *e_local;
  fct_logger_i *logger__local;
  
  ts_00 = e->ts;
  dVar8 = fct_ts__duration(ts_00);
  fct_switch_std_to_std(_stdout,1,fct_saved_stdout);
  fct_switch_std_to_std(_stderr,2,fct_saved_stderr);
  sVar3 = fct_ts__tst_cnt(ts_00);
  sVar4 = fct_ts__tst_cnt_passed(ts_00);
  sVar5 = fct_ts__tst_cnt(ts_00);
  printf("\t<testsuite errors=\"%lu\" failures=\"0\" tests=\"%lu\" name=\"%s\" time=\"%.4f\">\n",
         dVar8,sVar3 - sVar4,sVar5,ts_00->name);
  if (ts_00 != (fct_ts_t *)0xfffffffffffffef0) {
    sVar3 = fct_nlist__size(&ts_00->test_list);
    for (num_itemstest = 0; num_itemstest != sVar3; num_itemstest = num_itemstest + 1) {
      test_00 = (fct_test_t *)fct_nlist__at(&ts_00->test_list,num_itemstest);
      iVar2 = fct_test__is_pass(test_00);
      if (iVar2 == 0) {
        fct_test__duration(test_00);
        printf("\t\t<testcase name=\"%s\" time=\"%.3f\">\n",test_00->name);
      }
      else {
        fct_test__duration(test_00);
        printf("\t\t<testcase name=\"%s\" time=\"%.3f\"",test_00->name);
      }
      if (test_00 != (fct_test_t *)0x0) {
        sVar4 = fct_nlist__size((fct_nlist_t *)test_00);
        for (num_itemschk = 0; num_itemschk != sVar4; num_itemschk = num_itemschk + 1) {
          pvVar6 = fct_nlist__at((fct_nlist_t *)test_00,num_itemschk);
          printf("\t\t\t<error message=\"%s\" type=\"fctx\">",(long)pvVar6 + 0x208);
          printf("file:%s, line:%d",(long)pvVar6 + 0x100,(ulong)*(uint *)((long)pvVar6 + 0x200));
          printf("</error>\n");
        }
      }
      if (iVar2 == 0) {
        printf("\t\t</testcase>\n");
      }
      else {
        printf(" />\n");
      }
    }
  }
  bVar1 = true;
  printf("\t\t<system-out>\n\t\t\t<![CDATA[");
  while (uVar7 = read(fct_stdout_pipe[0],&first_out_line,0x400), 0 < (int)uVar7) {
    if (bVar1) {
      printf("\n");
      bVar1 = false;
    }
    printf("%.*s",uVar7 & 0xffffffff,&first_out_line);
  }
  printf("]]>\n\t\t</system-out>\n");
  bVar1 = true;
  printf("\t\t<system-err>\n\t\t\t<![CDATA[");
  while (uVar7 = read(fct_stderr_pipe[0],&first_out_line,0x400), 0 < (int)uVar7) {
    if (bVar1) {
      printf("\n");
      bVar1 = false;
    }
    printf("%.*s",uVar7 & 0xffffffff,&first_out_line);
  }
  printf("]]>\n\t\t</system-err>\n");
  printf("\t</testsuite>\n");
  return;
}

Assistant:

static void
fct_junit_logger__on_test_suite_end(
    fct_logger_i *logger_,
    fct_logger_evt_t const *e
)
{
    fct_ts_t const *ts = e->ts; /* Test Suite */
    nbool_t is_pass;
    double elasped_time = 0;
    char std_buffer[1024];
    int read_length;
    int first_out_line;

    fct_unused(logger_);

    elasped_time = fct_ts__duration(ts);

    FCT_SWITCH_STDOUT_TO_STDOUT();
    FCT_SWITCH_STDERR_TO_STDERR();

    /* opening testsuite tag */
    printf("\t<testsuite errors=\"%lu\" failures=\"0\" tests=\"%lu\" "
           "name=\"%s\" time=\"%.4f\">\n",
           (unsigned long)   fct_ts__tst_cnt(ts)
           - fct_ts__tst_cnt_passed(ts),
           (unsigned long) fct_ts__tst_cnt(ts),
           fct_ts__name(ts),
           elasped_time);

    FCT_NLIST_FOREACH_BGN(fct_test_t*, test, &(ts->test_list))
    {
        is_pass = fct_test__is_pass(test);

        /* opening testcase tag */
        if (is_pass)
        {
            printf("\t\t<testcase name=\"%s\" time=\"%.3f\"",
                   fct_test__name(test),
                   fct_test__duration(test)
                  );
        }
        else
        {
            printf("\t\t<testcase name=\"%s\" time=\"%.3f\">\n",
                   fct_test__name(test),
                   fct_test__duration(test)
                  );
        }

        FCT_NLIST_FOREACH_BGN(fctchk_t*, chk, &(test->failed_chks))
        {
            /* error tag */
            printf("\t\t\t<error message=\"%s\" "
                   "type=\"fctx\">", chk->msg);
            printf("file:%s, line:%d", chk->file, chk->lineno);
            printf("</error>\n");
        }
        FCT_NLIST_FOREACH_END();

        /* closing testcase tag */
        if (is_pass)
        {
            printf(" />\n");
        }
        else
        {
            printf("\t\t</testcase>\n");
        }
    }
    FCT_NLIST_FOREACH_END();

    /* print the std streams */
    first_out_line = 1;
    printf("\t\t<system-out>\n\t\t\t<![CDATA[");
    while ( (read_length = _fct_read(fct_stdout_pipe[0], std_buffer, 1024)) > 0)
    {
        if (first_out_line)
        {
            printf("\n");
            first_out_line = 0;
        }
        printf("%.*s", read_length, std_buffer);
    }
    printf("]]>\n\t\t</system-out>\n");

    first_out_line = 1;
    printf("\t\t<system-err>\n\t\t\t<![CDATA[");
    while ((read_length = _fct_read(fct_stderr_pipe[0], std_buffer, 1024)) > 0)
    {
        if (first_out_line)
        {
            printf("\n");
            first_out_line = 0;
        }
        printf("%.*s", read_length, std_buffer);
    }
    printf("]]>\n\t\t</system-err>\n");

    /* closing testsuite tag */
    printf("\t</testsuite>\n");
}